

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall sglr::rc::Texture2D::updateView(Texture2D *this,DepthStencilMode mode)

{
  uint uVar1;
  uint uVar2;
  ConstPixelBufferAccess *pCVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  uVar4 = (this->super_Texture).m_baseLevel;
  uVar5 = (ulong)uVar4;
  if ((uVar5 < 0xe) && ((this->m_levels).m_data[uVar5].m_cap != 0)) {
    uVar1 = (this->m_levels).m_access[uVar5].super_ConstPixelBufferAccess.m_size.m_data[0];
    uVar2 = (this->m_levels).m_access[uVar5].super_ConstPixelBufferAccess.m_size.m_data[1];
    if ((uVar2 != 0 && uVar1 != 0) &&
       ((this->m_levels).m_access[uVar5].super_ConstPixelBufferAccess.m_size.m_data[2] != 0)) {
      iVar7 = 1;
      if (LINEAR < (this->super_Texture).m_sampler.minFilter) {
        iVar6 = ((this->super_Texture).m_maxLevel - uVar4) + 1;
        if ((int)uVar2 < (int)uVar1) {
          uVar2 = uVar1;
        }
        uVar4 = 0x20;
        if (uVar2 != 0) {
          uVar4 = 0x1f;
          if (uVar2 != 0) {
            for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
            }
          }
          uVar4 = uVar4 ^ 0x1f;
        }
        iVar7 = 0x20 - uVar4;
        if (iVar6 < (int)(0x20 - uVar4)) {
          iVar7 = iVar6;
        }
      }
      TextureLevelArray::updateSamplerMode(&this->m_levels,mode);
      pCVar3 = (this->m_levels).m_effectiveAccess + uVar5;
      goto LAB_004d3cb8;
    }
  }
  iVar7 = 0;
  pCVar3 = (ConstPixelBufferAccess *)0x0;
LAB_004d3cb8:
  (this->m_view).m_numLevels = iVar7;
  (this->m_view).m_levels = pCVar3;
  return;
}

Assistant:

void Texture2D::updateView (tcu::Sampler::DepthStencilMode mode)
{
	const int baseLevel	= getBaseLevel();

	if (hasLevel(baseLevel) && !isEmpty(getLevel(baseLevel)))
	{
		// Update number of levels in mipmap pyramid.
		const int	width		= getLevel(baseLevel).getWidth();
		const int	height		= getLevel(baseLevel).getHeight();
		const bool	isMipmap	= isMipmapFilter(getSampler().minFilter);
		const int	numLevels	= isMipmap ? de::min(getMaxLevel()-baseLevel+1, getNumMipLevels2D(width, height)) : 1;

		m_levels.updateSamplerMode(mode);
		m_view = tcu::Texture2DView(numLevels, m_levels.getEffectiveLevels() + baseLevel);
	}
	else
		m_view = tcu::Texture2DView(0, DE_NULL);
}